

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusVtxbufFormat::emulate_mthd(MthdCelsiusVtxbufFormat *this)

{
  byte *pbVar1;
  uint32_t *puVar2;
  uint val;
  uint idx;
  int i;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  val = (this->super_SingleMthdTest).super_MthdTest.val;
  idx = *(uint *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  if (7 < idx) {
    bVar6 = false;
    goto LAB_001e3ecf;
  }
  uVar3 = val >> 4 & 0xf;
  switch(idx) {
  case 0:
    bVar6 = uVar3 - 5 < 0xfffffffd || 0x1ffffff < val;
    break;
  default:
    bVar6 = (val & 0xf) != 4 && (val & 0xd) != 0 || (val & 0xb0) != 0 && uVar3 != 3;
    goto LAB_001e3edf;
  case 3:
  case 4:
    bVar6 = uVar3 < 5;
    goto LAB_001e3ecc;
  case 5:
    bVar6 = uVar3 != 0 && uVar3 != 3;
    break;
  case 6:
  case 7:
    bVar6 = uVar3 < 2;
LAB_001e3ecc:
    bVar6 = !bVar6;
  }
LAB_001e3ecf:
  bVar6 = (bool)((val & 0xf) - 3 < 0xfffffffe | bVar6);
LAB_001e3edf:
  uVar7 = (uint)bVar6;
  uVar3 = uVar7 + 2;
  if (idx == 0) {
    uVar3 = uVar7;
  }
  if (val < 0x1000000) {
    uVar3 = uVar7;
  }
  if ((val & 0xff0300) != 0) {
    uVar3 = uVar7 + 2;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) ==
       0) || ((uVar4 = (this->super_SingleMthdTest).super_MthdTest.cls, uVar4 != 0x85 &&
              (uVar4 != 0x56)))) {
    if (uVar3 == 0) {
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
        uVar4 = pgraph_celsius_fixup_vtxbuf_format
                          (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,idx,val)
        ;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
        [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] = uVar4;
        pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                 celsius_pipe_vtx_state + 1);
        *pbVar1 = *pbVar1 & 0xe0;
        for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
          [lVar5] = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                    celsius_pipe_vtxbuf_format[0] & 0x1000000 |
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                    celsius_pipe_vtxbuf_format[lVar5] & 0xfeffffff;
        }
        if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
            chipset.chipset == 0x10) {
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
          [2] = ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                 celsius_pipe_vtxbuf_format[2] & 0xfffffffb) +
                (uint)(((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        celsius_pipe_vtxbuf_format[1] & 7) != 0) * 4;
        }
        uVar9 = 7;
        do {
          iVar8 = (int)uVar9;
          if (iVar8 == 0) break;
          puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                   celsius_pipe_vtxbuf_format + uVar9;
          uVar9 = (ulong)(iVar8 - 1);
        } while ((*puVar2 & 0x70) == 0);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state =
             ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state
             & 0xffffffe0) + iVar8;
      }
      return;
    }
  }
  else {
    uVar3 = uVar3 | 4;
  }
  MthdTest::warn((MthdTest *)this,uVar3);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		int comp = extr(val, 4, 4);
		if (idx == 0) {
			if (extr(val, 24, 8) > 1)
				err |= 1;
			if (comp != 2 && comp != 3 && comp != 4)
				err |= 1;
		} else if (idx == 1 || idx == 2) {
			if (comp != 0 && comp != 3 && comp != 4)
				err |= 1;
		} else if (idx == 3 || idx == 4) {
			if (comp > 4)
				err |= 1;
		} else if (idx == 5) {
			if (comp != 0 && comp != 3)
				err |= 1;
		} else if (idx == 6 || idx == 7) {
			if (comp != 0 && comp != 1)
				err |= 1;
		}
		int fmt = extr(val, 0, 4);
		if (idx == 1 || idx == 2) {
			if (fmt != 0 && fmt != 2 && fmt != 4)
				err |= 1;
		} else {
			if (fmt != 1 && fmt != 2)
				err |= 1;
		}
		if (val & 0xff000000 && idx != 0)
			err |= 2;
		if (val & 0x00ff0300)
			err |= 2;
		if (extr(exp.celsius_config_c, 8, 1) && (cls == 0x56 || cls == 0x85))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.celsius_pipe_vtxbuf_format[idx] = pgraph_celsius_fixup_vtxbuf_format(&exp, idx, val);
				insrt(exp.celsius_pipe_vtx_state, 8, 5, 0);
				for (int i = 0; i < 8; i++) {
					insrt(exp.celsius_pipe_vtxbuf_format[i], 24, 1, extr(exp.celsius_pipe_vtxbuf_format[0], 24, 1));
				}
				if (chipset.chipset == 0x10) {
					if (extr(exp.celsius_pipe_vtxbuf_format[1], 0, 3) == 0)
						insrt(exp.celsius_pipe_vtxbuf_format[2], 2, 1, 0);
					else
						insrt(exp.celsius_pipe_vtxbuf_format[2], 2, 1, 1);
				}
				int last = 7;
				while (last > 0 && extr(exp.celsius_pipe_vtxbuf_format[last], 4, 3) == 0)
					last--;
				insrt(exp.celsius_pipe_vtx_state, 0, 5, last);
			}
		}
	}